

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitMemAccess<false,false>
          (WasmBytecodeGenerator *this,WasmOp wasmOp,WasmType *signature,ViewType viewType)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  RegSlot location_;
  WasmReaderBase *pWVar4;
  WasmCompilationException *this_00;
  WasmRegisterSpace *this_01;
  OpCodeAsmJs op;
  EmitInfo EStack_54;
  RegSlot resultReg;
  EmitInfo exprInfo;
  uint32 offset;
  uint32 alignment;
  uint32 naturalAlignment;
  WasmType type;
  ViewType viewType_local;
  WasmType *signature_local;
  WasmBytecodeGenerator *pWStack_18;
  WasmOp wasmOp_local;
  WasmBytecodeGenerator *this_local;
  
  alignment = *signature;
  naturalAlignment._3_1_ = viewType;
  _type = signature;
  signature_local._6_2_ = wasmOp;
  pWStack_18 = this;
  SetUsesMemory(this,0);
  uVar2 = *(uint *)(Js::ArrayBufferView::NaturalAlignment + (ulong)naturalAlignment._3_1_ * 4);
  pWVar4 = GetReader(this);
  bVar1 = (pWVar4->m_currentNode).field_1.mem.alignment;
  pWVar4 = GetReader(this);
  uVar3 = (pWVar4->m_currentNode).field_1.brTable.numTargets;
  if (uVar2 < bVar1) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"alignment must not be larger than natural");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  EStack_54 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
  ReleaseLocation(this,&stack0xffffffffffffffac);
  this_01 = GetRegisterSpace(this,alignment);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_01);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1c])
            (this->m_writer,0x5a,(ulong)location_,(ulong)EStack_54 & 0xffffffff,(ulong)uVar3,
             (ulong)naturalAlignment._3_1_);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&alignment);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitMemAccess(WasmOp wasmOp, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType)
{
    Assert(!isAtomic || Wasm::Threads::IsEnabled());
    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = Js::ArrayBufferView::NaturalAlignment[viewType];
    const uint32 alignment = GetReader()->m_currentNode.mem.alignment;
    const uint32 offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }
    if (isAtomic && alignment != naturalAlignment)
    {
        throw WasmCompilationException(_u("invalid alignment for atomic RW. Expected %u, got %u"), naturalAlignment, alignment);
    }

    // Stores
    if (isStore)
    {
        EmitInfo rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
        EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
        Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::StArrAtomic : Js::OpCodeAsmJs::StArrWasm;
        m_writer->WasmMemAccess(op, rhsInfo.location, exprInfo.location, offset, viewType);
        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    // Loads
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
    ReleaseLocation(&exprInfo);
    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::LdArrAtomic : Js::OpCodeAsmJs::LdArrWasm;
    m_writer->WasmMemAccess(op, resultReg, exprInfo.location, offset, viewType);

    return EmitInfo(resultReg, type);
}